

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O2

void __thiscall kj::TlsContext::TlsContext(TlsContext *this,Options *options)

{
  TlsVersion TVar1;
  TlsCertificate *pTVar2;
  size_t sVar3;
  TlsKeypair *pTVar4;
  void *parg;
  TlsSniCallback *parg_00;
  Timer *pTVar5;
  int iVar6;
  SSL_METHOD *meth;
  X509_STORE *ctx_00;
  long lVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  TlsSniCallback *sni;
  SSL_CTX *ctx;
  Maybe<kj::Function<void_(kj::Exception_&&)>_> *local_60;
  Fault local_58;
  UnwindDetector _kjUnwindDetector775;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:775:3)>
  local_48;
  
  (this->super_SecureNetworkWrapper)._vptr_SecureNetworkWrapper =
       (_func_int **)&PTR_wrapServer_0059ebd8;
  (this->timer).ptr = (Timer *)0x0;
  (this->acceptTimeout).ptr.isSet = false;
  local_60 = &this->acceptErrorHandler;
  (this->acceptErrorHandler).ptr.isSet = false;
  meth = (SSL_METHOD *)TLS_method();
  ctx = (SSL_CTX *)SSL_CTX_new(meth);
  if ((SSL_CTX *)ctx == (SSL_CTX *)0x0) {
    anon_unknown_310::throwOpensslError();
  }
  UnwindDetector::UnwindDetector(&_kjUnwindDetector775);
  local_48.maybeFunc.ptr.isSet = true;
  local_48.maybeFunc.ptr.field_1.value.ctx = &ctx;
  local_48.maybeFunc.ptr.field_1.value._kjUnwindDetector775 = &_kjUnwindDetector775;
  if (options->useSystemTrustStore == true) {
    iVar6 = SSL_CTX_set_default_verify_paths((SSL_CTX *)ctx);
    if (iVar6 == 0) {
      anon_unknown_310::throwOpensslError();
    }
  }
  if ((options->trustedCertificates).size_ != 0) {
    ctx_00 = SSL_CTX_get_cert_store((SSL_CTX *)ctx);
    if (ctx_00 == (X509_STORE *)0x0) {
      anon_unknown_310::throwOpensslError();
    }
    pTVar2 = (options->trustedCertificates).ptr;
    sVar3 = (options->trustedCertificates).size_;
    lVar10 = 0;
    while (sVar3 * 0x50 - lVar10 != 0) {
      iVar6 = X509_STORE_add_cert(ctx_00,*(X509 **)((long)pTVar2->chain + lVar10));
      lVar10 = lVar10 + 0x50;
      if (iVar6 == 0) {
        anon_unknown_310::throwOpensslError();
      }
    }
  }
  if (options->verifyClients == true) {
    SSL_CTX_set_verify((SSL_CTX *)ctx,3,(callback *)0x0);
  }
  TVar1 = options->minVersion;
  uVar8 = (uint)(0 < (int)TVar1) * 0x2000000;
  uVar9 = uVar8 + 0x4000000;
  if ((int)TVar1 < 2) {
    uVar9 = uVar8;
  }
  uVar8 = uVar9 + 0x10000000;
  if ((int)TVar1 < 3) {
    uVar8 = uVar9;
  }
  uVar9 = uVar8 | 0x8000000;
  if ((int)TVar1 < 4) {
    uVar9 = uVar8;
  }
  uVar8 = uVar9 | 0x20000000;
  if ((int)TVar1 < 5) {
    uVar8 = uVar9;
  }
  SSL_CTX_set_options(ctx,uVar8);
  iVar6 = SSL_CTX_set_cipher_list((SSL_CTX *)ctx,(options->cipherList).content.ptr);
  if (iVar6 == 0) {
    anon_unknown_310::throwOpensslError();
  }
  if ((options->curveList).ptr.isSet == true) {
    lVar10 = SSL_CTX_ctrl((SSL_CTX *)ctx,0x5c,0,(options->curveList).ptr.field_1.value.content.ptr);
    if (lVar10 == 0) {
      anon_unknown_310::throwOpensslError();
    }
  }
  pTVar4 = (options->defaultKeypair).ptr;
  if (pTVar4 != (TlsKeypair *)0x0) {
    iVar6 = SSL_CTX_use_PrivateKey((SSL_CTX *)ctx,(EVP_PKEY *)(pTVar4->privateKey).pkey);
    if (iVar6 != 0) {
      iVar6 = SSL_CTX_use_certificate((SSL_CTX *)ctx,(X509 *)(pTVar4->certificate).chain[0]);
      if (iVar6 != 0) {
        for (lVar10 = 2;
            (lVar10 != 0xb && (parg = (pTVar4->certificate).chain[lVar10 + -1], parg != (void *)0x0)
            ); lVar10 = lVar10 + 1) {
          lVar7 = SSL_CTX_ctrl((SSL_CTX *)ctx,0xe,0,parg);
          if (lVar7 == 0) {
            anon_unknown_310::throwOpensslError();
          }
          X509_up_ref(parg);
        }
        goto LAB_003c4221;
      }
    }
    anon_unknown_310::throwOpensslError();
  }
LAB_003c4221:
  parg_00 = (options->sniCallback).ptr;
  if (parg_00 != (TlsSniCallback *)0x0) {
    SSL_CTX_callback_ctrl((SSL_CTX *)ctx,0x35,SniCallback::callback);
    SSL_CTX_ctrl((SSL_CTX *)ctx,0x36,0,parg_00);
  }
  if ((options->acceptTimeout).ptr.isSet == true) {
    pTVar5 = (options->timer).ptr;
    if (pTVar5 == (Timer *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[60]>
                (&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++"
                 ,0x365,FAILED,"options.timer != nullptr",
                 "\"acceptTimeout option requires that a timer is also provided\"",
                 (char (*) [60])"acceptTimeout option requires that a timer is also provided");
      kj::_::Debug::Fault::fatal(&local_58);
    }
    (this->timer).ptr = pTVar5;
    (this->acceptTimeout).ptr.field_1 = (options->acceptTimeout).ptr.field_1;
    (this->acceptTimeout).ptr.isSet = true;
  }
  Maybe<kj::Function<void_(kj::Exception_&&)>_>::operator=(local_60,&options->acceptErrorHandler);
  this->ctx = ctx;
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:775:3)>
  ::~Deferred(&local_48);
  return;
}

Assistant:

TlsContext::TlsContext(Options options) {
  ensureOpenSslInitialized();

#if OPENSSL_VERSION_NUMBER >= 0x10100000L || defined(OPENSSL_IS_BORINGSSL)
  SSL_CTX* ctx = SSL_CTX_new(TLS_method());
#else
  SSL_CTX* ctx = SSL_CTX_new(SSLv23_method());
#endif

  if (ctx == nullptr) {
    throwOpensslError();
  }
  KJ_ON_SCOPE_FAILURE(SSL_CTX_free(ctx));

  // honor options.useSystemTrustStore
  if (options.useSystemTrustStore) {
    if (!SSL_CTX_set_default_verify_paths(ctx)) {
      throwOpensslError();
    }
#ifdef _WIN32
    updateOpenSSLCAStoreWithWindowsCertificates(ctx);
#endif
  }

  // honor options.trustedCertificates
  if (options.trustedCertificates.size() > 0) {
    X509_STORE* store = SSL_CTX_get_cert_store(ctx);
    if (store == nullptr) {
      throwOpensslError();
    }
    for (auto& cert: options.trustedCertificates) {
      if (!X509_STORE_add_cert(store, reinterpret_cast<X509*>(cert.chain[0]))) {
        throwOpensslError();
      }
    }
  }

  if (options.verifyClients) {
    SSL_CTX_set_verify(ctx, SSL_VERIFY_PEER | SSL_VERIFY_FAIL_IF_NO_PEER_CERT, NULL);
  }

  // honor options.minVersion
  long optionFlags = 0;
  if (options.minVersion > TlsVersion::SSL_3) {
    optionFlags |= SSL_OP_NO_SSLv3;
  }
  if (options.minVersion > TlsVersion::TLS_1_0) {
    optionFlags |= SSL_OP_NO_TLSv1;
  }
  if (options.minVersion > TlsVersion::TLS_1_1) {
    optionFlags |= SSL_OP_NO_TLSv1_1;
  }
  if (options.minVersion > TlsVersion::TLS_1_2) {
    optionFlags |= SSL_OP_NO_TLSv1_2;
  }
  if (options.minVersion > TlsVersion::TLS_1_3) {
#ifdef SSL_OP_NO_TLSv1_3
    optionFlags |= SSL_OP_NO_TLSv1_3;
#else
    KJ_FAIL_REQUIRE("OpenSSL headers don't support TLS 1.3");
#endif
  }
  SSL_CTX_set_options(ctx, optionFlags);  // note: never fails; returns new options bitmask

  // honor options.cipherList
  if (!SSL_CTX_set_cipher_list(ctx, options.cipherList.cStr())) {
    throwOpensslError();
  }

  KJ_IF_SOME(curves, options.curveList) {
    if (!SSL_CTX_set1_curves_list(ctx, curves.cStr())){
      throwOpensslError();
    }
  }

  // honor options.defaultKeypair
  KJ_IF_SOME(kp, options.defaultKeypair) {
    if (!SSL_CTX_use_PrivateKey(ctx, reinterpret_cast<EVP_PKEY*>(kp.privateKey.pkey))) {
      throwOpensslError();
    }

    if (!SSL_CTX_use_certificate(ctx, reinterpret_cast<X509*>(kp.certificate.chain[0]))) {
      throwOpensslError();
    }

    for (size_t i = 1; i < kj::size(kp.certificate.chain); i++) {
      X509* x509 = reinterpret_cast<X509*>(kp.certificate.chain[i]);
      if (x509 == nullptr) break;  // end of chain

      if (!SSL_CTX_add_extra_chain_cert(ctx, x509)) {
        throwOpensslError();
      }

      // SSL_CTX_add_extra_chain_cert() does NOT up the refcount itself.
      X509_up_ref(x509);
    }
  }

  // honor options.sniCallback
  KJ_IF_SOME(sni, options.sniCallback) {
    SSL_CTX_set_tlsext_servername_callback(ctx, &SniCallback::callback);
    SSL_CTX_set_tlsext_servername_arg(ctx, &sni);
  }

  KJ_IF_SOME(timeout, options.acceptTimeout) {
    this->timer = KJ_REQUIRE_NONNULL(options.timer,
        "acceptTimeout option requires that a timer is also provided");
    this->acceptTimeout = timeout;
  }

  this->acceptErrorHandler = kj::mv(options.acceptErrorHandler);

  this->ctx = ctx;
}